

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbar_mugshot.cpp
# Opt level: O2

bool __thiscall FMugShot::SetState(FMugShot *this,char *state_name,bool wait_till_done,bool reset)

{
  FMugShotState *pFVar1;
  int in_EAX;
  FMugShotState *this_00;
  char *pcVar2;
  bool bVar3;
  FName local_28;
  FName local_24;
  
  local_28.Index = in_EAX;
  local_24.Index = FName::NameManager::FindName(&FName::NameData,state_name,true);
  this_00 = FindMugShotState(&local_24);
  if (this_00 == (FMugShotState *)0x0) {
    pcVar2 = strchr(state_name,0x2e);
    if (pcVar2 != (char *)0x0) {
      local_28.Index =
           FName::NameManager::FindName
                     (&FName::NameData,state_name,(long)pcVar2 - (long)state_name,true);
      this_00 = FindMugShotState(&local_28);
      if (this_00 != (FMugShotState *)0x0) goto LAB_005779bc;
    }
LAB_00577a19:
    bVar3 = false;
  }
  else {
LAB_005779bc:
    this->bNormal = false;
    this->bOuchActive = false;
    pFVar1 = this->CurrentState;
    if (this_00 == pFVar1) {
      if (!reset) {
        return true;
      }
    }
    else {
      if ((wait_till_done && pFVar1 != (FMugShotState *)0x0) &&
         ((undefined1  [40])((undefined1  [40])*pFVar1 & (undefined1  [40])0x10) ==
          (undefined1  [40])0x0)) goto LAB_00577a19;
      this->CurrentState = this_00;
    }
    FMugShotState::Reset(this_00);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool FMugShot::SetState(const char *state_name, bool wait_till_done, bool reset)
{
	// Search for full name.
	FMugShotState *state = FindMugShotState(FName(state_name, true));
	if (state == NULL)
	{
		// Search for initial name, if the full one contains a dot.
		const char *dot = strchr(state_name, '.');
		if (dot != NULL)
		{
			state = FindMugShotState(FName(state_name, dot - state_name, true));
		}
		if (state == NULL)
		{
			// Requested state does not exist, so do nothing.
			return false;
		}
	}
	bNormal = false; //Assume we are not setting god or normal for now.
	bOuchActive = false;
	if (state != CurrentState)
	{
		if (!wait_till_done || CurrentState == NULL || CurrentState->bFinished)
		{
			CurrentState = state;
			state->Reset();
			return true;
		}
		return false;
	}
	else if(reset)
	{
		state->Reset();
		return true;
	}
	return true;
}